

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O1

int kputc_(int c,kstring_t *s)

{
  char *pcVar1;
  ulong uVar2;
  size_t __size;
  
  uVar2 = s->l;
  if (s->m < uVar2 + 1) {
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    __size = (uVar2 >> 0x10 | uVar2) + 1;
    s->m = __size;
    pcVar1 = (char *)realloc(s->s,__size);
    if (pcVar1 == (char *)0x0) goto LAB_00115214;
    s->s = pcVar1;
  }
  pcVar1 = (char *)s->l;
  s->l = (size_t)(pcVar1 + 1);
  s->s[(long)pcVar1] = (char)c;
LAB_00115214:
  return (int)pcVar1;
}

Assistant:

static inline int kputc_(int c, kstring_t *s)
{
	if (s->l + 1 > s->m) {
		char *tmp;
		s->m = s->l + 1;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	s->s[s->l++] = c;
	return 1;
}